

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

void __thiscall
YAML::SingleDocParser::HandleBlockSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *this_00;
  undefined4 *puVar1;
  pointer pcVar2;
  undefined4 uVar3;
  bool bVar4;
  Token *pTVar5;
  Exception *pEVar6;
  Token token;
  string local_a8;
  undefined1 local_88 [12];
  int iStack_7c;
  undefined1 local_78 [24];
  undefined1 local_60 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  int local_38;
  
  Scanner::pop(this->m_scanner);
  this_00 = (deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *)
            (this->m_pCollectionStack)._M_t.
            super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
            ._M_t.
            super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
            .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl;
  local_88._0_4_ = UNVERIFIED;
  puVar1 = *(undefined4 **)(this_00 + 0x30);
  if (puVar1 == (undefined4 *)(*(long *)(this_00 + 0x40) + -4)) {
    std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>::
    _M_push_back_aux<YAML::CollectionType::value_const&>(this_00,(value *)local_88);
  }
  else {
    *puVar1 = 2;
    *(undefined4 **)(this_00 + 0x30) = puVar1 + 1;
  }
  do {
    bVar4 = Scanner::empty(this->m_scanner);
    if (bVar4) {
      pEVar6 = (Exception *)__cxa_allocate_exception(0x40);
      local_a8._0_12_ = Scanner::mark(this->m_scanner);
      local_88._0_8_ = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,"end of sequence not found","");
      Exception::Exception(pEVar6,(Mark *)&local_a8,(string *)local_88);
      *(undefined ***)pEVar6 = &PTR__BadFile_008779d0;
      __cxa_throw(pEVar6,&ParserException::typeinfo,BadFile::~BadFile);
    }
    pTVar5 = Scanner::peek(this->m_scanner);
    local_88._0_4_ = pTVar5->status;
    local_88._4_4_ = pTVar5->type;
    local_88._8_4_ = (pTVar5->mark).pos;
    iStack_7c = (pTVar5->mark).line;
    local_78._0_4_ = (pTVar5->mark).column;
    pcVar2 = (pTVar5->value)._M_dataplus._M_p;
    local_78._8_8_ = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 8),pcVar2,pcVar2 + (pTVar5->value)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_50,&pTVar5->params);
    local_38 = pTVar5->data;
    if ((local_88._4_4_ & ~DOC_END) != BLOCK_SEQ_END) {
      pEVar6 = (Exception *)__cxa_allocate_exception(0x40);
      local_a8._M_dataplus._M_p = (pointer)((long)&local_a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"end of sequence not found","");
      Exception::Exception(pEVar6,(Mark *)(local_88 + 8),&local_a8);
      *(undefined ***)pEVar6 = &PTR__BadFile_008779d0;
      __cxa_throw(pEVar6,&ParserException::typeinfo,BadFile::~BadFile);
    }
    Scanner::pop(this->m_scanner);
    uVar3 = local_88._4_4_;
    if (local_88._4_4_ != BLOCK_SEQ_END) {
      bVar4 = Scanner::empty(this->m_scanner);
      if (!bVar4) {
        pTVar5 = Scanner::peek(this->m_scanner);
        if ((pTVar5->type | DOC_END) == BLOCK_ENTRY) {
          (*eventHandler->_vptr_EventHandler[4])(eventHandler,&pTVar5->mark,0);
          goto LAB_0071976f;
        }
      }
      HandleNode(this,eventHandler);
    }
LAB_0071976f:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    if ((undefined1 *)local_78._8_8_ != local_60) {
      operator_delete((void *)local_78._8_8_);
    }
    if (uVar3 == BLOCK_SEQ_END) {
      std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::
      pop_back((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *)
               (this->m_pCollectionStack)._M_t.
               super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
               ._M_t.
               super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
               .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
      return;
    }
  } while( true );
}

Assistant:

void SingleDocParser::HandleBlockSequence(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::BlockSeq);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ);

    Token token = m_scanner.peek();
    if (token.type != Token::BLOCK_ENTRY && token.type != Token::BLOCK_SEQ_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_SEQ);

    m_scanner.pop();
    if (token.type == Token::BLOCK_SEQ_END)
      break;

    // check for null
    if (!m_scanner.empty()) {
      const Token& nextToken = m_scanner.peek();
      if (nextToken.type == Token::BLOCK_ENTRY ||
          nextToken.type == Token::BLOCK_SEQ_END) {
        eventHandler.OnNull(nextToken.mark, NullAnchor);
        continue;
      }
    }

    HandleNode(eventHandler);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::BlockSeq);
}